

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O1

wchar_t archive_read_format_zip_read_data_skip_streamable(archive_read *a)

{
  byte bVar1;
  void *pvVar2;
  long lVar3;
  bool bVar4;
  int64_t iVar5;
  char *pcVar6;
  int64_t *in_RCX;
  char *pcVar7;
  wchar_t wVar8;
  void *buff;
  size_t size;
  void *local_40;
  size_t local_38;
  
  pvVar2 = a->format->data;
  iVar5 = __archive_read_consume(a,*(int64_t *)((long)pvVar2 + 0x88));
  *(undefined8 *)((long)pvVar2 + 0x88) = 0;
  if (iVar5 < 0) {
    wVar8 = L'\xffffffe2';
  }
  else {
    wVar8 = L'\0';
    if (*(char *)((long)pvVar2 + 0xc2) == '\0') {
      lVar3 = *(long *)((long)pvVar2 + 0x90);
      if (((*(byte *)(lVar3 + 0x7e) & 8) == 0) || (0 < *(long *)(lVar3 + 0x28))) {
        iVar5 = __archive_read_consume(a,*(int64_t *)((long)pvVar2 + 0x98));
        wVar8 = (uint)(iVar5 >> 0x3f) & 0xffffffe2;
      }
      else if (*(char *)(lVar3 + 0x80) == '\b') {
        do {
          if (*(char *)((long)pvVar2 + 0xc2) != '\0') {
            return L'\0';
          }
          local_40 = (void *)0x0;
          local_38 = 0;
          wVar8 = zip_read_data_deflate(a,&local_40,&local_38,in_RCX);
        } while (wVar8 == L'\0');
      }
      else {
        do {
          pcVar6 = (char *)__archive_read_ahead(a,0x10,(ssize_t *)&local_40);
          if ((long)local_40 < 0x10) {
            bVar4 = false;
            archive_set_error(&a->archive,0x54,"Truncated ZIP file data");
            wVar8 = L'\xffffffe2';
          }
          else {
            pcVar7 = pcVar6;
            while (pcVar7 <= (char *)((long)local_40 + (long)pcVar6) + -0x10) {
              bVar1 = pcVar7[3];
              if (bVar1 < 0x4b) {
                if (bVar1 == 7) {
                  pcVar7 = pcVar7 + 1;
                }
                else {
                  if ((((bVar1 == 8) && (pcVar7[2] == '\a')) && (pcVar7[1] == 'K')) &&
                     (*pcVar7 == 'P')) {
                    if ((*(byte *)(*(long *)((long)pvVar2 + 0x90) + 0x82) & 1) == 0) {
                      lVar3 = 0x10 - (long)pcVar6;
                    }
                    else {
                      lVar3 = 0x18 - (long)pcVar6;
                    }
                    __archive_read_consume(a,(int64_t)(pcVar7 + lVar3));
                    bVar4 = false;
                    wVar8 = L'\0';
                    goto LAB_00137fb3;
                  }
LAB_00137f91:
                  pcVar7 = pcVar7 + 4;
                }
              }
              else if (bVar1 == 0x50) {
                pcVar7 = pcVar7 + 3;
              }
              else {
                if (bVar1 != 0x4b) goto LAB_00137f91;
                pcVar7 = pcVar7 + 2;
              }
            }
            __archive_read_consume(a,(long)pcVar7 - (long)pcVar6);
            bVar4 = true;
          }
LAB_00137fb3:
        } while (bVar4);
      }
    }
  }
  return wVar8;
}

Assistant:

static int
archive_read_format_zip_read_data_skip_streamable(struct archive_read *a)
{
	struct zip *zip;
	int64_t bytes_skipped;

	zip = (struct zip *)(a->format->data);
	bytes_skipped = __archive_read_consume(a, zip->unconsumed);
	zip->unconsumed = 0;
	if (bytes_skipped < 0)
		return (ARCHIVE_FATAL);

	/* If we've already read to end of data, we're done. */
	if (zip->end_of_entry)
		return (ARCHIVE_OK);

	/* So we know we're streaming... */
	if (0 == (zip->entry->zip_flags & ZIP_LENGTH_AT_END)
	    || zip->entry->compressed_size > 0) {
		/* We know the compressed length, so we can just skip. */
		bytes_skipped = __archive_read_consume(a, zip->entry_bytes_remaining);
		if (bytes_skipped < 0)
			return (ARCHIVE_FATAL);
		return (ARCHIVE_OK);
	}

	/* We're streaming and we don't know the length. */
	/* If the body is compressed and we know the format, we can
	 * find an exact end-of-entry by decompressing it. */
	switch (zip->entry->compression) {
#ifdef HAVE_ZLIB_H
	case 8: /* Deflate compression. */
		while (!zip->end_of_entry) {
			int64_t offset = 0;
			const void *buff = NULL;
			size_t size = 0;
			int r;
			r =  zip_read_data_deflate(a, &buff, &size, &offset);
			if (r != ARCHIVE_OK)
				return (r);
		}
		return ARCHIVE_OK;
#endif
	default: /* Uncompressed or unknown. */
		/* Scan for a PK\007\010 signature. */
		for (;;) {
			const char *p, *buff;
			ssize_t bytes_avail;
			buff = __archive_read_ahead(a, 16, &bytes_avail);
			if (bytes_avail < 16) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Truncated ZIP file data");
				return (ARCHIVE_FATAL);
			}
			p = buff;
			while (p <= buff + bytes_avail - 16) {
				if (p[3] == 'P') { p += 3; }
				else if (p[3] == 'K') { p += 2; }
				else if (p[3] == '\007') { p += 1; }
				else if (p[3] == '\010' && p[2] == '\007'
				    && p[1] == 'K' && p[0] == 'P') {
					if (zip->entry->flags & LA_USED_ZIP64)
						__archive_read_consume(a, p - buff + 24);
					else
						__archive_read_consume(a, p - buff + 16);
					return ARCHIVE_OK;
				} else { p += 4; }
			}
			__archive_read_consume(a, p - buff);
		}
	}
}